

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls_cbc.cc
# Opt level: O3

int EVP_sha256_final_with_secret_suffix
              (SHA256_CTX *ctx,uint8_t *out,uint8_t *in,size_t len,size_t max_len)

{
  uint8_t *puVar1;
  long lVar2;
  long lVar3;
  uint32_t *puVar4;
  uint uVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  short sVar13;
  short sVar14;
  short sVar15;
  short sVar16;
  short sVar17;
  short sVar18;
  short sVar19;
  short sVar20;
  short sVar21;
  byte bVar22;
  byte bVar23;
  undefined1 auVar24 [15];
  undefined1 auVar25 [15];
  undefined1 auVar26 [15];
  undefined1 auVar27 [15];
  undefined1 auVar28 [15];
  undefined1 auVar29 [15];
  undefined1 auVar30 [15];
  uint uVar31;
  uint uVar32;
  uint uVar33;
  uint uVar34;
  undefined2 uVar35;
  undefined1 auVar36 [15];
  undefined1 auVar37 [15];
  undefined1 auVar38 [15];
  uint uVar39;
  uint uVar40;
  int iVar41;
  ulong uVar42;
  long lVar43;
  size_t i;
  ulong uVar44;
  ulong uVar45;
  ulong uVar46;
  ulong __n;
  ulong uVar47;
  undefined5 uVar48;
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  uint32_t result [8];
  uint8_t block [64];
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  
  iVar41 = 0;
  if (((max_len >> 0x3d == 0) && (iVar41 = 0, ctx->Nh == 0)) &&
     (uVar39 = ctx->Nl, iVar41 = 0,
     max_len * 8 + (ulong)uVar39 >> 0x20 == 0 && !CARRY8(max_len * 8,(ulong)uVar39))) {
    uVar5 = ctx->num;
    uVar47 = len + uVar5 + 0x48 >> 6;
    uVar39 = uVar39 + (int)len * 8;
    local_98 = ZEXT416(uVar39 * 0x1000000 |
                       (uVar39 & 0xff00) << 8 | (uVar39 >> 0x10 & 0xff) << 8 | uVar39 >> 0x18);
    local_48 = (undefined1  [16])0x0;
    local_58 = (undefined1  [16])0x0;
    local_68 = (undefined1  [16])0x0;
    local_78 = (undefined1  [16])0x0;
    local_a8 = (undefined1  [16])0x0;
    local_b8 = (undefined1  [16])0x0;
    uVar45 = 0;
    uVar44 = 0;
    do {
      if ((uVar44 == 0) && (__n = (ulong)ctx->num, __n != 0)) {
        memcpy(local_78,ctx->data,__n);
      }
      else {
        __n = 0;
      }
      uVar42 = max_len - uVar45;
      if (uVar45 <= max_len && uVar42 != 0) {
        uVar46 = 0x40 - __n;
        if (uVar42 <= 0x40 - __n) {
          uVar46 = uVar42;
        }
        if (uVar46 != 0) {
          memcpy(local_78 + __n,in + uVar45,uVar46);
        }
      }
      if ((uint)__n < 0x40) {
        uVar42 = uVar45;
        uVar46 = __n;
        do {
          bVar23 = (byte)(uVar42 >> 0x38);
          bVar22 = (byte)((len ^ uVar42) >> 0x38);
          local_78[uVar46] =
               (byte)((len ^ uVar42) - 1 >> 0x38) & ~bVar22 & 0x80 |
               (char)(((byte)(uVar42 - len >> 0x38) ^ bVar23 | bVar22) ^ bVar23) >> 7 &
               local_78[uVar46];
          uVar46 = uVar46 + 1;
          uVar42 = uVar42 + 1;
        } while (uVar46 != 0x40);
      }
      uVar39 = (uint)((uVar44 ^ uVar47 - 1) - 1 >> 0x20) & (uint)(-uVar47 >> 0x20);
      uVar40 = (int)uVar39 >> 0x1f;
      local_88 = ZEXT416(uVar40);
      auVar49[3] = (char)((int)uVar39 >> 0x1f);
      uVar35 = CONCAT11(auVar49[3],auVar49[3]);
      uVar48 = CONCAT14(auVar49[3],uVar40);
      auVar49._4_4_ = (int)(CONCAT35(CONCAT21(uVar35,auVar49[3]),uVar48) >> 0x20);
      auVar49[2] = auVar49[3];
      auVar49[1] = auVar49[3];
      auVar49[0] = auVar49[3];
      auVar49._8_8_ = 0;
      auVar49 = pshuflw(auVar49,auVar49,0);
      local_48._12_4_ = local_48._12_4_ | auVar49._0_4_ & local_98._0_4_;
      SHA256_Transform((SHA256_CTX *)ctx,local_78);
      lVar43 = 0;
      do {
        puVar4 = ctx->h + lVar43;
        uVar32 = puVar4[1];
        uVar33 = puVar4[2];
        uVar34 = puVar4[3];
        lVar2 = lVar43 * 4;
        uVar39 = *(uint *)(local_b8 + lVar2 + 4);
        uVar40 = *(uint *)(local_b8 + lVar2 + 8);
        uVar31 = *(uint *)(local_a8 + lVar2 + -4);
        lVar3 = lVar43 * 4;
        *(uint32_t *)(local_b8 + lVar3) = *puVar4 & local_88._0_4_ | *(uint *)(local_b8 + lVar2);
        *(uint *)(local_b8 + lVar3 + 4) = uVar32 & local_88._0_4_ | uVar39;
        *(uint *)(local_b8 + lVar3 + 8) = uVar33 & local_88._0_4_ | uVar40;
        *(uint *)(local_a8 + lVar3 + -4) = uVar34 & local_88._0_4_ | uVar31;
        lVar43 = lVar43 + 4;
      } while (lVar43 != 8);
      uVar45 = (uVar45 + 0x40) - __n;
      uVar44 = uVar44 + 1;
    } while (uVar44 != max_len + uVar5 + 0x48 >> 6);
    lVar43 = 0;
    do {
      auVar49 = *(undefined1 (*) [16])(local_b8 + lVar43 * 4);
      auVar51[1] = 0;
      auVar51[0] = auVar49[8];
      auVar51[2] = auVar49[9];
      auVar51[3] = 0;
      auVar51[4] = auVar49[10];
      auVar51[5] = 0;
      auVar51[6] = auVar49[0xb];
      auVar51[7] = 0;
      auVar51[8] = auVar49[0xc];
      auVar51[9] = 0;
      auVar51[10] = auVar49[0xd];
      auVar51[0xb] = 0;
      auVar51[0xc] = auVar49[0xe];
      auVar51[0xd] = 0;
      auVar51[0xe] = auVar49[0xf];
      auVar51[0xf] = 0;
      auVar50 = pshuflw(auVar51,auVar51,0x1b);
      auVar51 = pshufhw(auVar50,auVar50,0x1b);
      auVar24[0xd] = 0;
      auVar24._0_13_ = auVar49._0_13_;
      auVar24[0xe] = auVar49[7];
      auVar25[0xc] = auVar49[6];
      auVar25._0_12_ = auVar49._0_12_;
      auVar25._13_2_ = auVar24._13_2_;
      auVar26[0xb] = 0;
      auVar26._0_11_ = auVar49._0_11_;
      auVar26._12_3_ = auVar25._12_3_;
      auVar27[10] = auVar49[5];
      auVar27._0_10_ = auVar49._0_10_;
      auVar27._11_4_ = auVar26._11_4_;
      auVar28[9] = 0;
      auVar28._0_9_ = auVar49._0_9_;
      auVar28._10_5_ = auVar27._10_5_;
      auVar29[8] = auVar49[4];
      auVar29._0_8_ = auVar49._0_8_;
      auVar29._9_6_ = auVar28._9_6_;
      auVar36._7_8_ = 0;
      auVar36._0_7_ = auVar29._8_7_;
      auVar37._1_8_ = SUB158(auVar36 << 0x40,7);
      auVar37[0] = auVar49[3];
      auVar37._9_6_ = 0;
      auVar38._1_10_ = SUB1510(auVar37 << 0x30,5);
      auVar38[0] = auVar49[2];
      auVar38._11_4_ = 0;
      auVar30[2] = auVar49[1];
      auVar30._0_2_ = auVar49._0_2_;
      auVar30._3_12_ = SUB1512(auVar38 << 0x20,3);
      auVar50._0_2_ = auVar49._0_2_ & 0xff;
      auVar50._2_13_ = auVar30._2_13_;
      auVar50[0xf] = 0;
      auVar49 = pshuflw(auVar50,auVar50,0x1b);
      auVar49 = pshufhw(auVar49,auVar49,0x1b);
      sVar6 = auVar49._0_2_;
      sVar7 = auVar49._2_2_;
      sVar8 = auVar49._4_2_;
      sVar9 = auVar49._6_2_;
      sVar10 = auVar49._8_2_;
      sVar11 = auVar49._10_2_;
      sVar12 = auVar49._12_2_;
      sVar13 = auVar49._14_2_;
      sVar14 = auVar51._0_2_;
      sVar15 = auVar51._2_2_;
      sVar16 = auVar51._4_2_;
      sVar17 = auVar51._6_2_;
      sVar18 = auVar51._8_2_;
      sVar19 = auVar51._10_2_;
      sVar20 = auVar51._12_2_;
      sVar21 = auVar51._14_2_;
      puVar1 = out + lVar43 * 4;
      *puVar1 = (0 < sVar6) * (sVar6 < 0x100) * auVar49[0] - (0xff < sVar6);
      puVar1[1] = (0 < sVar7) * (sVar7 < 0x100) * auVar49[2] - (0xff < sVar7);
      puVar1[2] = (0 < sVar8) * (sVar8 < 0x100) * auVar49[4] - (0xff < sVar8);
      puVar1[3] = (0 < sVar9) * (sVar9 < 0x100) * auVar49[6] - (0xff < sVar9);
      puVar1[4] = (0 < sVar10) * (sVar10 < 0x100) * auVar49[8] - (0xff < sVar10);
      puVar1[5] = (0 < sVar11) * (sVar11 < 0x100) * auVar49[10] - (0xff < sVar11);
      puVar1[6] = (0 < sVar12) * (sVar12 < 0x100) * auVar49[0xc] - (0xff < sVar12);
      puVar1[7] = (0 < sVar13) * (sVar13 < 0x100) * auVar49[0xe] - (0xff < sVar13);
      puVar1[8] = (0 < sVar14) * (sVar14 < 0x100) * auVar51[0] - (0xff < sVar14);
      puVar1[9] = (0 < sVar15) * (sVar15 < 0x100) * auVar51[2] - (0xff < sVar15);
      puVar1[10] = (0 < sVar16) * (sVar16 < 0x100) * auVar51[4] - (0xff < sVar16);
      puVar1[0xb] = (0 < sVar17) * (sVar17 < 0x100) * auVar51[6] - (0xff < sVar17);
      puVar1[0xc] = (0 < sVar18) * (sVar18 < 0x100) * auVar51[8] - (0xff < sVar18);
      puVar1[0xd] = (0 < sVar19) * (sVar19 < 0x100) * auVar51[10] - (0xff < sVar19);
      puVar1[0xe] = (0 < sVar20) * (sVar20 < 0x100) * auVar51[0xc] - (0xff < sVar20);
      puVar1[0xf] = (0 < sVar21) * (sVar21 < 0x100) * auVar51[0xe] - (0xff < sVar21);
      lVar43 = lVar43 + 4;
    } while (lVar43 != 8);
    iVar41 = 1;
  }
  return iVar41;
}

Assistant:

int EVP_sha256_final_with_secret_suffix(SHA256_CTX *ctx,
                                        uint8_t out[SHA256_DIGEST_LENGTH],
                                        const uint8_t *in, size_t len,
                                        size_t max_len) {
  // Bound the input length so |total_bits| below fits in four bytes. This is
  // redundant with TLS record size limits. This also ensures |input_idx| below
  // does not overflow.
  size_t max_len_bits = max_len << 3;
  if (ctx->Nh != 0 ||
      (max_len_bits >> 3) != max_len ||  // Overflow
      ctx->Nl + max_len_bits < max_len_bits ||
      ctx->Nl + max_len_bits > UINT32_MAX) {
    return 0;
  }

  // We need to hash the following into |ctx|:
  //
  // - ctx->data[:ctx->num]
  // - in[:len]
  // - A 0x80 byte
  // - However many zero bytes are needed to pad up to a block.
  // - Eight bytes of length.
  size_t num_blocks = (ctx->num + len + 1 + 8 + SHA256_CBLOCK - 1) >> 6;
  size_t last_block = num_blocks - 1;
  size_t max_blocks = (ctx->num + max_len + 1 + 8 + SHA256_CBLOCK - 1) >> 6;

  // The bounds above imply |total_bits| fits in four bytes.
  size_t total_bits = ctx->Nl + (len << 3);
  uint8_t length_bytes[4];
  length_bytes[0] = (uint8_t)(total_bits >> 24);
  length_bytes[1] = (uint8_t)(total_bits >> 16);
  length_bytes[2] = (uint8_t)(total_bits >> 8);
  length_bytes[3] = (uint8_t)total_bits;

  // We now construct and process each expected block in constant-time.
  uint8_t block[SHA256_CBLOCK] = {0};
  uint32_t result[8] = {0};
  // input_idx is the index into |in| corresponding to the current block.
  // However, we allow this index to overflow beyond |max_len|, to simplify the
  // 0x80 byte.
  size_t input_idx = 0;
  for (size_t i = 0; i < max_blocks; i++) {
    // Fill |block| with data from the partial block in |ctx| and |in|. We copy
    // as if we were hashing up to |max_len| and then zero the excess later.
    size_t block_start = 0;
    if (i == 0) {
      OPENSSL_memcpy(block, ctx->data, ctx->num);
      block_start = ctx->num;
    }
    if (input_idx < max_len) {
      size_t to_copy = SHA256_CBLOCK - block_start;
      if (to_copy > max_len - input_idx) {
        to_copy = max_len - input_idx;
      }
      OPENSSL_memcpy(block + block_start, in + input_idx, to_copy);
    }

    // Zero any bytes beyond |len| and add the 0x80 byte.
    for (size_t j = block_start; j < SHA256_CBLOCK; j++) {
      // input[idx] corresponds to block[j].
      size_t idx = input_idx + j - block_start;
      // The barriers on |len| are not strictly necessary. However, without
      // them, GCC compiles this code by incorporating |len| into the loop
      // counter and subtracting it out later. This is still constant-time, but
      // it frustrates attempts to validate this.
      uint8_t is_in_bounds = constant_time_lt_8(idx, value_barrier_w(len));
      uint8_t is_padding_byte = constant_time_eq_8(idx, value_barrier_w(len));
      block[j] &= is_in_bounds;
      block[j] |= 0x80 & is_padding_byte;
    }

    input_idx += SHA256_CBLOCK - block_start;

    // Fill in the length if this is the last block.
    crypto_word_t is_last_block = constant_time_eq_w(i, last_block);
    for (size_t j = 0; j < 4; j++) {
      block[SHA256_CBLOCK - 4 + j] |= is_last_block & length_bytes[j];
    }

    // Process the block and save the hash state if it is the final value.
    SHA256_Transform(ctx, block);
    for (size_t j = 0; j < 8; j++) {
      result[j] |= is_last_block & ctx->h[j];
    }
  }

  // Write the output.
  for (size_t i = 0; i < 8; i++) {
    CRYPTO_store_u32_be(out + 4 * i, result[i]);
  }
  return 1;
}